

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<unsigned_short>::resize(SmallVectorImpl<unsigned_short> *this,size_type N)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  iterator E;
  iterator I;
  size_type N_local;
  SmallVectorImpl<unsigned_short> *this_local;
  
  sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
  if (N < sVar3) {
    lVar1 = *(long *)this;
    lVar2 = *(long *)this;
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    SmallVectorTemplateBase<unsigned_short,_true>::destroy_range
              ((unsigned_short *)(lVar1 + N * 2),(unsigned_short *)(lVar2 + sVar3 * 2));
    SmallVectorBase::set_size((SmallVectorBase *)this,N);
  }
  else {
    sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
    if (sVar3 < N) {
      sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
      if (sVar3 < N) {
        SmallVectorTemplateBase<unsigned_short,_true>::grow
                  ((SmallVectorTemplateBase<unsigned_short,_true> *)this,N);
      }
      lVar1 = *(long *)this;
      sVar3 = SmallVectorBase::size((SmallVectorBase *)this);
      lVar2 = *(long *)this;
      for (E = (iterator)(lVar1 + sVar3 * 2); E != (iterator)(lVar2 + N * 2); E = E + 1) {
        *E = 0;
      }
      SmallVectorBase::set_size((SmallVectorBase *)this,N);
    }
  }
  return;
}

Assistant:

void resize(size_type N) {
    if (N < this->size()) {
      this->destroy_range(this->begin()+N, this->end());
      this->set_size(N);
    } else if (N > this->size()) {
      if (this->capacity() < N)
        this->grow(N);
      for (auto I = this->end(), E = this->begin() + N; I != E; ++I)
        new (&*I) T();
      this->set_size(N);
    }
  }